

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.c
# Opt level: O0

int comex_group_translate_world(comex_group_t group,int group_rank,int *world_rank)

{
  int code;
  comex_igroup_t *pcVar1;
  comex_igroup_t *msg;
  undefined4 *in_RDX;
  undefined4 in_ESI;
  int in_EDI;
  int status;
  comex_igroup_t *world_igroup;
  comex_igroup_t *igroup;
  comex_group_t in_stack_ffffffffffffffdc;
  undefined1 local_8 [8];
  
  if (in_EDI == 0) {
    *in_RDX = in_ESI;
  }
  else {
    pcVar1 = comex_get_igroup_from_group(in_stack_ffffffffffffffdc);
    msg = comex_get_igroup_from_group(in_stack_ffffffffffffffdc);
    code = MPI_Group_translate_ranks(pcVar1->group,1,local_8,msg->group,in_RDX);
    if (code != 0) {
      comex_error((char *)msg,code);
    }
  }
  return 0;
}

Assistant:

int comex_group_translate_world(comex_group_t group, int group_rank, int *world_rank)
{
    if (COMEX_GROUP_WORLD == group) {
        *world_rank = group_rank;
    }
    else {
        comex_igroup_t *igroup = comex_get_igroup_from_group(group);
        comex_igroup_t *world_igroup = comex_get_igroup_from_group(COMEX_GROUP_WORLD);
        int status = MPI_Group_translate_ranks(
                igroup->group, 1, &group_rank, world_igroup->group, world_rank);
        if (status != MPI_SUCCESS) {
            comex_error("MPI_Group_translate_ranks: Failed ", status);
        }
    }

    return COMEX_SUCCESS;
}